

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  Tick endTick;
  Simulation *this;
  void *this_00;
  Queue *this_01;
  double dVar2;
  AvgQueueSizeStat avgSizeStat;
  Source source;
  Queue que;
  Sink sink;
  ExponentialVar at;
  ExponentialVar st;
  double mu;
  double lambda;
  char *in_stack_fffffffffffffc68;
  Sink *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  DebugStream *in_stack_fffffffffffffc80;
  Node *in_stack_fffffffffffffc88;
  Source *in_stack_fffffffffffffc90;
  Node *in_stack_fffffffffffffc98;
  Queue *in_stack_fffffffffffffca0;
  ProduceEvent *in_stack_fffffffffffffca8;
  AvgQueueSizeStat *in_stack_fffffffffffffcb0;
  allocator *paVar3;
  int nRuns;
  Queue *in_stack_fffffffffffffcb8;
  AvgQueueSizeStat *in_stack_fffffffffffffcc0;
  Tick local_338;
  allocator local_329;
  string local_328 [32];
  Tick local_308 [27];
  BaseStat *in_stack_fffffffffffffdd0;
  CONFIDENCE_INTERVAL in_stack_fffffffffffffe5c;
  BaseStat *in_stack_fffffffffffffe60;
  double local_10;
  double local_8;
  
  std::operator<<((ostream *)&std::cout,"          ###### M/M/1 example ######\n\n");
  std::operator<<((ostream *)&std::cout,"Insert lambda : ");
  std::istream::operator>>(&std::cin,&local_8);
  std::operator<<((ostream *)&std::cout,"Insert mu : ");
  std::istream::operator>>(&std::cin,&local_10);
  if (local_10 <= local_8) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "lambda must be less than mu (otherwise is unstable!!)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  MetaSim::ExponentialVar::ExponentialVar
            ((ExponentialVar *)in_stack_fffffffffffffc70,(double)in_stack_fffffffffffffc68);
  MetaSim::ExponentialVar::ExponentialVar
            ((ExponentialVar *)in_stack_fffffffffffffc70,(double)in_stack_fffffffffffffc68);
  Sink::Sink(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  Queue::Queue(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (RandomVar *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
  Source::Source(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (RandomVar *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
  AvgQueueSizeStat::AvgQueueSizeStat
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
  MetaSim::attach_stat<Source::ProduceEvent,AvgQueueSizeStat>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  MetaSim::Tick::Tick(local_308,2000);
  MetaSim::BaseStat::setTransitory(local_308[0]);
  endTick.v = (impl_t)MetaSim::Simulation::getInstance();
  MetaSim::DebugStream::setStream
            ((DebugStream *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
  this = MetaSim::Simulation::getInstance();
  paVar3 = &local_329;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"All",paVar3);
  nRuns = (int)((ulong)paVar3 >> 0x20);
  MetaSim::DebugStream::enable(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  MetaSim::Simulation::getInstance();
  MetaSim::Tick::Tick(&local_338,2000000);
  MetaSim::Simulation::run(this,endTick,nRuns);
  poVar1 = std::operator<<((ostream *)&std::cout,"The average queue length is ");
  dVar2 = MetaSim::BaseStat::getMean(in_stack_fffffffffffffdd0);
  this_00 = (void *)std::ostream::operator<<(poVar1,dVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"with a 95% confidence interval of ");
  dVar2 = MetaSim::BaseStat::getConfInterval(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  this_01 = (Queue *)std::ostream::operator<<(poVar1,dVar2);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  AvgQueueSizeStat::~AvgQueueSizeStat((AvgQueueSizeStat *)0x1365d8);
  Source::~Source((Source *)this_01);
  Queue::~Queue(this_01);
  Sink::~Sink((Sink *)0x1365ff);
  MetaSim::ExponentialVar::~ExponentialVar((ExponentialVar *)0x13660c);
  MetaSim::ExponentialVar::~ExponentialVar((ExponentialVar *)0x136619);
  return 0;
}

Assistant:

int main() 
{
        double lambda, mu;

        cout << "          ###### M/M/1 example ######\n\n";

        cout << "Insert lambda : ";
        cin >> lambda;

        cout << "Insert mu : ";
        cin >> mu;

        if (lambda >= mu) {
                cout << "lambda must be less than mu (otherwise is unstable!!)" 
                     << endl;
                exit(-1);
        }

        ExponentialVar st(lambda);
        ExponentialVar at(mu);

        Sink sink("sink");
        Queue que(&sink, &st, "M/M/1 queue");
        Source source(&que, &at, "source");

        AvgQueueSizeStat avgSizeStat(que, "avg_queue_size");
        //avgSizeStat.attach(&source);
        attach_stat(avgSizeStat, source._prodEvent);

        BaseStat::setTransitory(2000);
  
        SIMUL.dbg.setStream("log.txt");
        SIMUL.dbg.enable("All");

        SIMUL.run(2000000, 8);

        cout << "The average queue length is " 
             << avgSizeStat.getMean() << endl;
        cout << "with a 95% confidence interval of " 
             << avgSizeStat.getConfInterval(BaseStat::C95) << endl;
}